

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t exr_get_attribute_count(exr_const_context_t ctxt,int part_index,int32_t *count)

{
  int32_t iVar1;
  exr_const_context_t c;
  int32_t *in_RDX;
  int in_ESI;
  char *in_RDI;
  exr_const_priv_part_t part;
  int32_t cnt;
  exr_const_context_t in_stack_ffffffffffffffd0;
  exr_result_t local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 2;
  }
  else {
    if (*in_RDI == '\x01') {
      internal_exr_lock(in_stack_ffffffffffffffd0);
    }
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      if (*in_RDI == '\x01') {
        internal_exr_unlock(in_stack_ffffffffffffffd0);
      }
      local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      c = *(exr_const_context_t *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      iVar1 = (c->filename).length;
      if (*in_RDI == '\x01') {
        internal_exr_unlock(c);
      }
      if (in_RDX == (int32_t *)0x0) {
        local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,3);
      }
      else {
        *in_RDX = iVar1;
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_get_attribute_count (
    exr_const_context_t ctxt, int part_index, int32_t* count)
{
    int32_t cnt;
    EXR_LOCK_WRITE_AND_DEFINE_PART (part_index);
    cnt = part->attributes.num_attributes;
    if (ctxt->mode == EXR_CONTEXT_WRITE) internal_exr_unlock (ctxt);

    if (!count) return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT);
    *count = cnt;
    return EXR_ERR_SUCCESS;
}